

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::requiresAdvancedBlendEq
          (anon_unknown_0 *this,BlendState *pre,BlendState post,
          vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
          *drawBuffers)

{
  pointer pDVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  pointer *ppDVar5;
  ulong uVar6;
  
  if (((this == (anon_unknown_0 *)0x0) || (*this != (anon_unknown_0)0x1)) ||
     (0x1c < **(int **)(this + 8) - 0x9294U)) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0x1e0015ff >> ((byte)(**(int **)(this + 8) - 0x9294U) & 0x1f);
  }
  if ((pre != (BlendState *)0x0) && (*(char *)&(pre->enableBlend).m_ptr == '\x01')) {
    uVar4 = *(int *)(pre->enableBlend).field_1 - 0x9294;
    uVar3 = (uint)(byte)((byte)uVar3 | (byte)(0x1e0015ff >> ((byte)uVar4 & 0x1f)) & uVar4 < 0x1d);
  }
  bVar2 = (byte)uVar3;
  uVar4 = (uint)((ulong)(in_RCX - (long)drawBuffers) >> 7);
  if (0 < (int)uVar4) {
    uVar6 = (ulong)(uVar4 & 0x7fffffff);
    ppDVar5 = &drawBuffers[1].
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      pDVar1 = *ppDVar5;
      if ((pDVar1 != (pointer)0x0) && (pDVar1->m_render == true)) {
        uVar4 = **(int **)((pDVar1->m_size).m_data + 1) - 0x9294;
        uVar3 = (uint)(byte)((byte)uVar3 | (byte)(0x1e0015ff >> ((byte)uVar4 & 0x1f)) & uVar4 < 0x1d
                            );
      }
      bVar2 = (byte)uVar3;
      ppDVar5 = ppDVar5 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool requiresAdvancedBlendEq (const BlendState& pre, const BlendState post, const vector<DrawBufferInfo>& drawBuffers)
{
	bool requiresAdvancedBlendEq = false;

	if (pre.blendEq && pre.blendEq->is<BlendEq>())
		requiresAdvancedBlendEq |= isAdvancedBlendEq(pre.blendEq->get<BlendEq>());

	if (post.blendEq && post.blendEq->is<BlendEq>())
		requiresAdvancedBlendEq |= isAdvancedBlendEq(post.blendEq->get<BlendEq>());

	for (int drawBufferNdx = 0; drawBufferNdx < (int)drawBuffers.size(); drawBufferNdx++)
	{
		const BlendState& drawBufferBlendState = drawBuffers[drawBufferNdx].getBlendState();

		if (drawBufferBlendState.blendEq && drawBufferBlendState.blendEq->is<BlendEq>())
			requiresAdvancedBlendEq |= isAdvancedBlendEq(drawBufferBlendState.blendEq->get<BlendEq>());
	}

	return requiresAdvancedBlendEq;
}